

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

bool __thiscall libcellml::Units::doIsResolved(Units *this)

{
  UnitsImpl *this_00;
  bool bVar1;
  History history;
  UnitsConstPtr UStack_38;
  History local_28;
  
  local_28.
  super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (UnitsImpl *)(this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
  std::__shared_ptr<libcellml::Units_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Units,void>
            ((__shared_ptr<libcellml::Units_const,(__gnu_cxx::_Lock_policy)2> *)&UStack_38,
             (__weak_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libcellml::Units>);
  bVar1 = UnitsImpl::performTestWithHistory(this_00,&local_28,&UStack_38,RESOLVED);
  if (UStack_38.super___shared_ptr<const_libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (UStack_38.super___shared_ptr<const_libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ::~vector(&local_28);
  return bVar1;
}

Assistant:

Units::UnitsImpl *Units::pFunc()
{
    return reinterpret_cast<Units::UnitsImpl *>(Entity::pFunc());
}